

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

void __thiscall
Js::JavascriptLibrary::SetBoxedObjectValue_TTD
          (JavascriptLibrary *this,RecyclableObject *obj,Var value)

{
  TypeId TVar1;
  JavascriptBooleanObject *this_00;
  JavascriptNumberObject *this_01;
  JavascriptStringObject *this_02;
  JavascriptSymbolObject *this_03;
  Var value_local;
  RecyclableObject *obj_local;
  JavascriptLibrary *this_local;
  
  TVar1 = RecyclableObject::GetTypeId(obj);
  switch(TVar1) {
  case TypeIds_BooleanObject:
    this_00 = VarTo<Js::JavascriptBooleanObject,Js::RecyclableObject>(obj);
    JavascriptBooleanObject::SetValue_TTD(this_00,value);
    break;
  case TypeIds_NumberObject:
    this_01 = VarTo<Js::JavascriptNumberObject,Js::RecyclableObject>(obj);
    JavascriptNumberObject::SetValue_TTD(this_01,value);
    break;
  case TypeIds_StringObject:
    this_02 = VarTo<Js::JavascriptStringObject,Js::RecyclableObject>(obj);
    JavascriptStringObject::SetValue_TTD(this_02,value);
    break;
  default:
    TTDAbort_unrecoverable_error("Unsupported nullptr value boxed object.");
  case TypeIds_SymbolObject:
    this_03 = VarTo<Js::JavascriptSymbolObject,Js::RecyclableObject>(obj);
    JavascriptSymbolObject::SetValue_TTD(this_03,value);
  }
  return;
}

Assistant:

void JavascriptLibrary::SetBoxedObjectValue_TTD(Js::RecyclableObject* obj, Js::Var value)
    {
        switch(obj->GetTypeId())
        {
        case Js::TypeIds_BooleanObject:
            Js::VarTo<Js::JavascriptBooleanObject>(obj)->SetValue_TTD(value);
            break;
        case Js::TypeIds_NumberObject:
            Js::VarTo<Js::JavascriptNumberObject>(obj)->SetValue_TTD(value);
            break;
        case Js::TypeIds_StringObject:
            Js::VarTo<Js::JavascriptStringObject>(obj)->SetValue_TTD(value);
            break;
        case Js::TypeIds_SymbolObject:
            Js::VarTo<Js::JavascriptSymbolObject>(obj)->SetValue_TTD(value);
            break;
        default:
            TTDAssert(false, "Unsupported nullptr value boxed object.");
            break;
        }
    }